

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeValueAndFinal(UCharsTrieBuilder *this,int32_t i,UBool isFinal)

{
  ssize_t sVar1;
  uint local_28;
  ushort local_24;
  short local_22;
  int32_t length;
  UChar intUnits [3];
  UBool isFinal_local;
  int32_t i_local;
  UCharsTrieBuilder *this_local;
  
  length._3_1_ = isFinal;
  intUnits._0_4_ = i;
  unique0x100000ae = this;
  if ((i < 0) || (0x3fff < i)) {
    local_22 = (short)((uint)i >> 0x10);
    if ((i < 0) || (0x3ffeffff < i)) {
      local_24 = 0x7fff;
      local_28 = 3;
      length._0_2_ = (short)i;
    }
    else {
      local_24 = local_22 + 0x4000;
      local_28 = 2;
      local_22 = (short)i;
    }
    local_24 = local_24 | (ushort)((int)isFinal << 0xf);
    sVar1 = write(this,(int)&local_24,(void *)(ulong)local_28,(ulong)(uint)((int)isFinal << 0xf));
    this_local._4_4_ = (int)sVar1;
  }
  else {
    this_local._4_4_ =
         (*(this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf])
                   (this,(ulong)(uint)(i | (int)isFinal << 0xf));
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UCharsTrieBuilder::writeValueAndFinal(int32_t i, UBool isFinal) {
    if(0<=i && i<=UCharsTrie::kMaxOneUnitValue) {
        return write(i|(isFinal<<15));
    }
    UChar intUnits[3];
    int32_t length;
    if(i<0 || i>UCharsTrie::kMaxTwoUnitValue) {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitValueLead);
        intUnits[1]=(UChar)((uint32_t)i>>16);
        intUnits[2]=(UChar)i;
        length=3;
    // } else if(i<=UCharsTrie::kMaxOneUnitValue) {
    //     intUnits[0]=(UChar)(i);
    //     length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitValueLead+(i>>16));
        intUnits[1]=(UChar)i;
        length=2;
    }
    intUnits[0]=(UChar)(intUnits[0]|(isFinal<<15));
    return write(intUnits, length);
}